

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O2

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  bool bVar2;
  pointer pvVar3;
  bool bVar4;
  bool strip_trailing_whitespace;
  bool bVar5;
  __type _Var6;
  int iVar7;
  uint uVar8;
  pointer pbVar9;
  long lVar10;
  cmsysProcess *cp;
  char *pcVar11;
  ostream *poVar12;
  bool bVar13;
  vector<const_char_*,_std::allocator<const_char_*>_> *cmd;
  vector<char_const*,std::allocator<char_const*>> *this_00;
  pointer pvVar14;
  cmMakefile *pcVar15;
  int idx;
  size_t i;
  pointer pbVar16;
  vector<char,_std::allocator<char>_> *output;
  ulong uVar17;
  cmProcessOutput processOutput;
  char buf [16];
  Encoding local_400;
  int length;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char *data;
  double timeout;
  string output_variable;
  string error_variable;
  string output_file;
  string results_variable;
  string result_variable;
  string error_file;
  string strdata;
  string working_directory;
  string input_file;
  string timeout_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  _Vector_base<char,_std::allocator<char>_> local_c0;
  _Vector_base<char,_std::allocator<char>_> local_a8;
  string local_90;
  string local_70;
  string arguments;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar16 == pbVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strdata,"called with incorrect number of arguments",
               (allocator<char> *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,&strdata);
    std::__cxx11::string::~string((string *)&strdata);
    return false;
  }
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmds.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
  arguments._M_string_length = 0;
  timeout_string._M_dataplus._M_p = (pointer)&timeout_string.field_2;
  timeout_string._M_string_length = 0;
  arguments.field_2._M_local_buf[0] = '\0';
  input_file._M_dataplus._M_p = (pointer)&input_file.field_2;
  input_file._M_string_length = 0;
  output_file._M_dataplus._M_p = (pointer)&output_file.field_2;
  output_file._M_string_length = 0;
  timeout_string.field_2._M_local_buf[0] = '\0';
  input_file.field_2._M_local_buf[0] = '\0';
  error_file._M_dataplus._M_p = (pointer)&error_file.field_2;
  error_file._M_string_length = 0;
  output_variable._M_dataplus._M_p = (pointer)&output_variable.field_2;
  output_variable._M_string_length = 0;
  output_file.field_2._M_local_buf[0] = '\0';
  error_file.field_2._M_local_buf[0] = '\0';
  error_variable._M_dataplus._M_p = (pointer)&error_variable.field_2;
  error_variable._M_string_length = 0;
  result_variable._M_dataplus._M_p = (pointer)&result_variable.field_2;
  result_variable._M_string_length = 0;
  output_variable.field_2._M_local_buf[0] = '\0';
  error_variable.field_2._M_local_buf[0] = '\0';
  results_variable._M_dataplus._M_p = (pointer)&results_variable.field_2;
  results_variable._M_string_length = 0;
  working_directory._M_dataplus._M_p = (pointer)&working_directory.field_2;
  working_directory._M_string_length = 0;
  result_variable.field_2._M_local_buf[0] = '\0';
  results_variable.field_2._M_local_buf[0] = '\0';
  strip_trailing_whitespace = false;
  working_directory.field_2._M_local_buf[0] = '\0';
  local_400 = None;
  bVar13 = false;
  bVar2 = false;
  bVar1 = false;
  lVar10 = 0;
  bVar5 = false;
  for (uVar17 = 0; uVar17 < (ulong)((long)pbVar9 - (long)pbVar16 >> 5); uVar17 = uVar17 + 1) {
    bVar4 = std::operator==(pbVar16 + uVar17,"COMMAND");
    if (bVar4) {
      lVar10 = ((long)cmds.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)cmds.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      std::
      vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ::emplace_back<>(&cmds);
LAB_001b01c8:
      bVar5 = true;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar17,"OUTPUT_VARIABLE")
      ;
      if (bVar4) {
        uVar17 = uVar17 + 1;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strdata," called with no value for OUTPUT_VARIABLE.",
                     (allocator<char> *)buf);
          cmCommand::SetError(&this->super_cmCommand,&strdata);
          goto LAB_001b0fe8;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar17,"ERROR_VARIABLE"
                               );
        if (bVar4) {
          uVar17 = uVar17 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&strdata," called with no value for ERROR_VARIABLE.",
                       (allocator<char> *)buf);
            cmCommand::SetError(&this->super_cmCommand,&strdata);
            goto LAB_001b0fe8;
          }
          std::__cxx11::string::_M_assign((string *)&error_variable);
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                  "RESULT_VARIABLE");
          if (bVar4) {
            uVar17 = uVar17 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&strdata," called with no value for RESULT_VARIABLE.",
                         (allocator<char> *)buf);
              cmCommand::SetError(&this->super_cmCommand,&strdata);
              goto LAB_001b0fe8;
            }
            std::__cxx11::string::_M_assign((string *)&result_variable);
          }
          else {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                    "RESULTS_VARIABLE");
            if (bVar4) {
              uVar17 = uVar17 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&strdata," called with no value for RESULTS_VARIABLE.",
                           (allocator<char> *)buf);
                cmCommand::SetError(&this->super_cmCommand,&strdata);
                goto LAB_001b0fe8;
              }
              std::__cxx11::string::_M_assign((string *)&results_variable);
            }
            else {
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                      "WORKING_DIRECTORY");
              if (bVar4) {
                uVar17 = uVar17 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&strdata," called with no value for WORKING_DIRECTORY.",
                             (allocator<char> *)buf);
                  cmCommand::SetError(&this->super_cmCommand,&strdata);
                  goto LAB_001b0fe8;
                }
                std::__cxx11::string::_M_assign((string *)&working_directory);
              }
              else {
                bVar4 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                        "INPUT_FILE");
                if (bVar4) {
                  uVar17 = uVar17 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&strdata," called with no value for INPUT_FILE.",
                               (allocator<char> *)buf);
                    cmCommand::SetError(&this->super_cmCommand,&strdata);
                    goto LAB_001b0fe8;
                  }
                  std::__cxx11::string::_M_assign((string *)&input_file);
                }
                else {
                  bVar4 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                          "OUTPUT_FILE");
                  if (bVar4) {
                    uVar17 = uVar17 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&strdata," called with no value for OUTPUT_FILE.",
                                 (allocator<char> *)buf);
                      cmCommand::SetError(&this->super_cmCommand,&strdata);
                      goto LAB_001b0fe8;
                    }
                    std::__cxx11::string::_M_assign((string *)&output_file);
                  }
                  else {
                    bVar4 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                            "ERROR_FILE");
                    if (bVar4) {
                      uVar17 = uVar17 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17)
                      {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&strdata," called with no value for ERROR_FILE.",
                                   (allocator<char> *)buf);
                        cmCommand::SetError(&this->super_cmCommand,&strdata);
                        goto LAB_001b0fe8;
                      }
                      std::__cxx11::string::_M_assign((string *)&error_file);
                    }
                    else {
                      bVar4 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                              "TIMEOUT");
                      if (bVar4) {
                        uVar17 = uVar17 + 1;
                        if ((ulong)((long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar17
                           ) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&strdata," called with no value for TIMEOUT.",
                                     (allocator<char> *)buf);
                          cmCommand::SetError(&this->super_cmCommand,&strdata);
                          goto LAB_001b0fe8;
                        }
                        std::__cxx11::string::_M_assign((string *)&timeout_string);
                      }
                      else {
                        bVar4 = std::operator==((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar17,
                                                "OUTPUT_QUIET");
                        if (bVar4) {
                          bVar1 = true;
                        }
                        else {
                          bVar4 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,"ERROR_QUIET");
                          if (bVar4) {
                            bVar2 = true;
                          }
                          else {
                            bVar4 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,"OUTPUT_STRIP_TRAILING_WHITESPACE");
                            if (bVar4) {
                              bVar13 = true;
                            }
                            else {
                              bVar4 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,"ERROR_STRIP_TRAILING_WHITESPACE");
                              if (bVar4) {
                                strip_trailing_whitespace = true;
                              }
                              else {
                                bVar4 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17,"ENCODING");
                                if (!bVar4) {
                                  if (bVar5) {
                                    strdata._M_dataplus._M_p =
                                         (args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                         _M_dataplus._M_p;
                                    std::vector<char_const*,std::allocator<char_const*>>::
                                    emplace_back<char_const*>
                                              ((vector<char_const*,std::allocator<char_const*>> *)
                                               (cmds.
                                                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                               (char **)&strdata);
                                    goto LAB_001b01c8;
                                  }
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)&strdata);
                                  poVar12 = std::operator<<((ostream *)&strdata,
                                                            " given unknown argument \"");
                                  poVar12 = std::operator<<(poVar12,(string *)
                                                                    ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17));
                                  std::operator<<(poVar12,"\".");
                                  std::__cxx11::stringbuf::str();
                                  cmCommand::SetError(&this->super_cmCommand,(string *)buf);
                                  std::__cxx11::string::~string((string *)buf);
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)&strdata);
                                  goto LAB_001b0ff5;
                                }
                                uVar17 = uVar17 + 1;
                                pbVar16 = (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start;
                                if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pbVar16 >> 5) <= uVar17) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&strdata,
                                             " called with no value for ENCODING.",
                                             (allocator<char> *)buf);
                                  cmCommand::SetError(&this->super_cmCommand,&strdata);
                                  goto LAB_001b0fe8;
                                }
                                local_400 = cmProcessOutput::FindEncoding(pbVar16 + uVar17);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar5 = false;
    }
    pbVar16 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,&output_file);
  pvVar3 = cmds.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   "attempted to output into a file: ",&output_file);
    std::operator+(&strdata,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf
                   ," into a source directory.");
    std::__cxx11::string::~string((string *)buf);
    cmCommand::SetError(&this->super_cmCommand,&strdata);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_001b0fe8:
    std::__cxx11::string::~string((string *)&strdata);
LAB_001b0ff5:
    bVar13 = false;
    goto LAB_001b0ff7;
  }
  if (cmds.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      cmds.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strdata," called with no COMMAND argument.",(allocator<char> *)buf);
    cmCommand::SetError(&this->super_cmCommand,&strdata);
    goto LAB_001b0fe8;
  }
  for (this_00 = (vector<char_const*,std::allocator<char_const*>> *)
                 cmds.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 != (vector<char_const*,std::allocator<char_const*>> *)pvVar3; this_00 = this_00 + 0x18
      ) {
    if (*(long *)this_00 == *(long *)(this_00 + 8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&strdata," given COMMAND argument with no value.",(allocator<char> *)buf)
      ;
      cmCommand::SetError(&this->super_cmCommand,&strdata);
      goto LAB_001b0fe8;
    }
    strdata._M_dataplus._M_p = (pointer)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              (this_00,(char **)&strdata);
  }
  timeout = -1.0;
  if ((timeout_string._M_string_length != 0) &&
     (iVar7 = __isoc99_sscanf(timeout_string._M_dataplus._M_p,"%lg",&timeout), iVar7 != 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strdata," called with TIMEOUT value that could not be parsed.",
               (allocator<char> *)buf);
    cmCommand::SetError(&this->super_cmCommand,&strdata);
    goto LAB_001b0fe8;
  }
  cp = cmsysProcess_New();
  pvVar3 = cmds.
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar14 = cmds.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar3; pvVar14 = pvVar14 + 1
      ) {
    cmsysProcess_AddCommand
              (cp,(pvVar14->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                  .super__Vector_impl_data._M_start);
  }
  if (working_directory._M_string_length != 0) {
    cmsysProcess_SetWorkingDirectory(cp,working_directory._M_dataplus._M_p);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (input_file._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,1,input_file._M_dataplus._M_p);
  }
  if (output_file._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,output_file._M_dataplus._M_p);
  }
  if (error_file._M_string_length == 0) {
LAB_001b085e:
    bVar5 = false;
  }
  else {
    _Var6 = std::operator==(&error_file,&output_file);
    bVar5 = true;
    if (!_Var6) {
      cmsysProcess_SetPipeFile(cp,3,error_file._M_dataplus._M_p);
      goto LAB_001b085e;
    }
  }
  if (output_variable._M_string_length == 0) {
    if (bVar5) goto LAB_001b0888;
LAB_001b0902:
    bVar5 = false;
  }
  else {
    _Var6 = std::operator==(&output_variable,&error_variable);
    if (!_Var6 && !bVar5) goto LAB_001b0902;
LAB_001b0888:
    bVar5 = true;
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= timeout) {
    cmsysProcess_SetTimeout(cp,timeout);
  }
  cmsysProcess_Execute(cp);
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,local_400,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
LAB_001b099e:
  do {
    while (iVar7 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar7 == 2) {
      if (!bVar1) {
        if (output_variable._M_string_length == 0) {
          cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
          cmSystemTools::Stdout(&strdata);
        }
        else {
          output = &tempOutput;
LAB_001b0a0a:
          cmExecuteProcessCommandAppend(output,data,length);
        }
      }
    }
    if (iVar7 == 3) {
      if (!bVar2) {
        output = &tempError;
        if (error_variable._M_string_length != 0) goto LAB_001b0a0a;
        cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
        cmSystemTools::Stderr(&strdata);
      }
      goto LAB_001b099e;
    }
  } while (iVar7 != 0);
  if ((!bVar1) && (output_variable._M_string_length == 0)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,1);
    std::__cxx11::string::~string((string *)&local_70);
    if (strdata._M_string_length != 0) {
      cmSystemTools::Stdout(&strdata);
    }
  }
  if ((!bVar2) && (error_variable._M_string_length == 0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    cmProcessOutput::DecodeText(&processOutput,&local_90,&strdata,2);
    std::__cxx11::string::~string((string *)&local_90);
    if (strdata._M_string_length != 0) {
      cmSystemTools::Stderr(&strdata);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_a8,&tempOutput);
  cmProcessOutput::DecodeText
            (&processOutput,(vector<char,_std::allocator<char>_> *)&local_a8,&tempOutput,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_a8);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_c0,&tempError);
  cmProcessOutput::DecodeText
            (&processOutput,(vector<char,_std::allocator<char>_> *)&local_c0,&tempError,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_c0);
  cmExecuteProcessCommandFixText(&tempOutput,bVar13);
  cmExecuteProcessCommandFixText(&tempError,strip_trailing_whitespace);
  if ((output_variable._M_string_length != 0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&output_variable,
               tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if ((!bVar5 && error_variable._M_string_length != 0) &&
     (tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&error_variable,
               tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (result_variable._M_string_length == 0) goto switchD_001b0c74_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar15 = (this->super_cmCommand).Makefile;
    pcVar11 = cmsysProcess_GetErrorString(cp);
    goto LAB_001b0d38;
  case 2:
    pcVar15 = (this->super_cmCommand).Makefile;
    pcVar11 = cmsysProcess_GetExceptionString(cp);
LAB_001b0d38:
    cmMakefile::AddDefinition(pcVar15,&result_variable,pcVar11);
    break;
  case 4:
    uVar8 = cmsysProcess_GetExitValue(cp);
    sprintf(buf,"%d",(ulong)uVar8);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&result_variable,buf);
    break;
  case 5:
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&result_variable,"Process terminated due to timeout"
              );
  }
switchD_001b0c74_caseD_3:
  if (results_variable._M_string_length == 0) goto switchD_001b0d9a_caseD_3;
  iVar7 = cmsysProcess_GetState(cp);
  switch(iVar7) {
  case 1:
    pcVar15 = (this->super_cmCommand).Makefile;
    pcVar11 = cmsysProcess_GetErrorString(cp);
    goto LAB_001b0e71;
  case 2:
    pcVar15 = (this->super_cmCommand).Makefile;
    pcVar11 = cmsysProcess_GetExceptionString(cp);
LAB_001b0e71:
    cmMakefile::AddDefinition(pcVar15,&results_variable,pcVar11);
    break;
  case 4:
    res.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    res.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    res.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar17 = 0;
        uVar17 < (ulong)(((long)cmds.
                                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)cmds.
                               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar17 = uVar17 + 1) {
      idx = (int)uVar17;
      iVar7 = cmsysProcess_GetStateByIndex(cp,idx);
      if (iVar7 == 2) {
        buf._0_8_ = cmsysProcess_GetExceptionStringByIndex(cp,idx);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&res,
                   (char **)buf);
      }
      else if (iVar7 == 4) {
        uVar8 = cmsysProcess_GetExitValueByIndex(cp,idx);
        sprintf(buf,"%d",(ulong)uVar8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&res,&buf);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[36]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&res,
                   (char (*) [36])"Error getting the child return code");
      }
    }
    pcVar15 = (this->super_cmCommand).Makefile;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)buf,&res,";");
    cmMakefile::AddDefinition(pcVar15,&results_variable,(char *)buf._0_8_);
    std::__cxx11::string::~string((string *)buf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&res);
    break;
  case 5:
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&results_variable,
               "Process terminated due to timeout");
  }
switchD_001b0d9a_caseD_3:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempError.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  bVar13 = true;
LAB_001b0ff7:
  std::__cxx11::string::~string((string *)&working_directory);
  std::__cxx11::string::~string((string *)&results_variable);
  std::__cxx11::string::~string((string *)&result_variable);
  std::__cxx11::string::~string((string *)&error_variable);
  std::__cxx11::string::~string((string *)&output_variable);
  std::__cxx11::string::~string((string *)&error_file);
  std::__cxx11::string::~string((string *)&output_file);
  std::__cxx11::string::~string((string *)&input_file);
  std::__cxx11::string::~string((string *)&timeout_string);
  std::__cxx11::string::~string((string *)&arguments);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&cmds);
  return bVar13;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::vector<const char*>> cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string results_variable;
  std::string working_directory;
  cmProcessOutput::Encoding encoding = cmProcessOutput::None;
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      doing_command = true;
      command_index = cmds.size();
      cmds.emplace_back();
    } else if (args[i] == "OUTPUT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        output_variable = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "ERROR_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        error_variable = args[i];
      } else {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULT_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        result_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "RESULTS_VARIABLE") {
      doing_command = false;
      if (++i < args.size()) {
        results_variable = args[i];
      } else {
        this->SetError(" called with no value for RESULTS_VARIABLE.");
        return false;
      }
    } else if (args[i] == "WORKING_DIRECTORY") {
      doing_command = false;
      if (++i < args.size()) {
        working_directory = args[i];
      } else {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
      }
    } else if (args[i] == "INPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        input_file = args[i];
      } else {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
      }
    } else if (args[i] == "OUTPUT_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        output_file = args[i];
      } else {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
      }
    } else if (args[i] == "ERROR_FILE") {
      doing_command = false;
      if (++i < args.size()) {
        error_file = args[i];
      } else {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
      }
    } else if (args[i] == "TIMEOUT") {
      doing_command = false;
      if (++i < args.size()) {
        timeout_string = args[i];
      } else {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
      }
    } else if (args[i] == "OUTPUT_QUIET") {
      doing_command = false;
      output_quiet = true;
    } else if (args[i] == "ERROR_QUIET") {
      doing_command = false;
      error_quiet = true;
    } else if (args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      output_strip_trailing_whitespace = true;
    } else if (args[i] == "ERROR_STRIP_TRAILING_WHITESPACE") {
      doing_command = false;
      error_strip_trailing_whitespace = true;
    } else if (args[i] == "ENCODING") {
      doing_command = false;
      if (++i < args.size()) {
        encoding = cmProcessOutput::FindEncoding(args[i]);
      } else {
        this->SetError(" called with no value for ENCODING.");
        return false;
      }
    } else if (doing_command) {
      cmds[command_index].push_back(args[i].c_str());
    } else {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(output_file)) {
    std::string e = "attempted to output into a file: " + output_file +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (cmds.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (auto& cmd : cmds) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
    // Add the null terminating pointer to the command argument list.
    cmd.push_back(nullptr);
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!timeout_string.empty()) {
    if (sscanf(timeout_string.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for (auto const& cmd : cmds) {
    cmsysProcess_AddCommand(cp, cmd.data());
  }

  // Set the process working directory.
  if (!working_directory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!input_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
  }
  if (!output_file.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
  }
  if (!error_file.empty()) {
    if (error_file == output_file) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
    }
  }
  if (!output_variable.empty() && output_variable == error_variable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet) {
      if (output_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !error_quiet) {
      if (error_variable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!output_quiet && output_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!error_quiet && error_variable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput, output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError, error_strip_trailing_whitespace);

  // Store the output obtained.
  if (!output_variable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(output_variable, tempOutput.data());
  }
  if (!merge_output && !error_variable.empty() && !tempError.empty()) {
    this->Makefile->AddDefinition(error_variable, tempError.data());
  }

  // Store the result of running the process.
  if (!result_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!results_variable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < cmds.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(results_variable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(results_variable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(results_variable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}